

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

cmJSONHelper<std::nullptr_t> *
cmCMakePresetsGraphInternal::VendorHelper
          (cmJSONHelper<std::nullptr_t> *__return_storage_ptr__,ErrorGenerator *error)

{
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_38;
  ErrorGenerator *local_18;
  ErrorGenerator *error_local;
  
  local_18 = error;
  error_local = (ErrorGenerator *)__return_storage_ptr__;
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::function(&local_38,error);
  std::function<bool(decltype(nullptr)&,Json::Value_const*,cmJSONState*)>::
  function<cmCMakePresetsGraphInternal::VendorHelper(std::function<void(Json::Value_const*,cmJSONState*)>const&)::__0,void>
            ((function<bool(decltype(nullptr)&,Json::Value_const*,cmJSONState*)> *)
             __return_storage_ptr__,(anon_class_32_1_a7dec128 *)&local_38);
  VendorHelper(std::function<void(Json::Value_const*,cmJSONState*)>const&)::$_0::~__0
            ((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

cmJSONHelper<std::nullptr_t> VendorHelper(const ErrorGenerator& error)
{
  return [error](std::nullptr_t& /*out*/, const Json::Value* value,
                 cmJSONState* state) -> bool {
    if (!value) {
      return true;
    }

    if (!value->isObject()) {
      error(value, state);
      return false;
    }

    return true;
  };
}